

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWgammaramp * glfwGetGammaRamp(GLFWmonitor *handle)

{
  GLFWbool GVar1;
  _GLFWmonitor *monitor;
  GLFWmonitor *handle_local;
  
  if (handle != (GLFWmonitor *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local = (GLFWmonitor *)0x0;
    }
    else {
      _glfwFreeGammaArrays((GLFWgammaramp *)(handle + 0x68));
      GVar1 = _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,(GLFWgammaramp *)(handle + 0x68));
      if (GVar1 == 0) {
        handle_local = (GLFWmonitor *)0x0;
      }
      else {
        handle_local = handle + 0x68;
      }
    }
    return (GLFWgammaramp *)handle_local;
  }
  __assert_fail("monitor != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/glfw/src/monitor.c"
                ,0x1f9,"const GLFWgammaramp *glfwGetGammaRamp(GLFWmonitor *)");
}

Assistant:

GLFWAPI const GLFWgammaramp* glfwGetGammaRamp(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    _glfwFreeGammaArrays(&monitor->currentRamp);
    if (!_glfwPlatformGetGammaRamp(monitor, &monitor->currentRamp))
        return NULL;

    return &monitor->currentRamp;
}